

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,spv_operand_pattern_t *pattern)

{
  spv_operand_type_t *psVar1;
  iterator iVar2;
  spv_operand_type_t local_10;
  spv_operand_type_t local_c;
  
  local_c = type;
  switch(type) {
  case SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE:
    iVar2._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar2._M_current != psVar1) {
      *iVar2._M_current = SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
      goto LAB_005e4d24;
    }
    std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
    _M_realloc_insert<spv_operand_type_t_const&>
              ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar2,
               &local_c);
LAB_005e4d4a:
    iVar2._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
    iVar2._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar2._M_current == psVar1) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar2,
                 &local_c);
      iVar2._M_current =
           (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar2._M_current = SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER;
      iVar2._M_current = iVar2._M_current + 1;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_10 = SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER;
    if (iVar2._M_current != psVar1) {
      *iVar2._M_current = SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER;
      goto LAB_005e4d8f;
    }
    goto LAB_005e4d99;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
    iVar2._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar2._M_current == psVar1) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar2,
                 &local_c);
      iVar2._M_current =
           (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar2._M_current = SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID;
      iVar2._M_current = iVar2._M_current + 1;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_10 = SPV_OPERAND_TYPE_ID;
    if (iVar2._M_current == psVar1) {
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
      _M_realloc_insert<spv_operand_type_t>(pattern,iVar2,&local_10);
      iVar2._M_current =
           (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar2._M_current = SPV_OPERAND_TYPE_ID;
      iVar2._M_current = iVar2._M_current + 1;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_10 = SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER;
    if (iVar2._M_current == psVar1) goto LAB_005e4d99;
    *iVar2._M_current = SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER;
    goto LAB_005e4d8f;
  case SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE:
    iVar2._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar2._M_current == psVar1) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar2,
                 &local_c);
      iVar2._M_current =
           (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      psVar1 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar2._M_current = SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE;
      iVar2._M_current = iVar2._M_current + 1;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_10 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    if (iVar2._M_current == psVar1) {
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
      _M_realloc_insert<spv_operand_type_t>(pattern,iVar2,&local_10);
      goto LAB_005e4d4a;
    }
    *iVar2._M_current = SPV_OPERAND_TYPE_LITERAL_INTEGER;
LAB_005e4d24:
    iVar2._M_current = iVar2._M_current + 1;
    (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
    break;
  default:
    return false;
  }
  local_10 = SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE;
  if (iVar2._M_current == psVar1) {
LAB_005e4d99:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
    _M_realloc_insert<spv_operand_type_t>(pattern,iVar2,&local_10);
  }
  else {
    *iVar2._M_current = SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE;
LAB_005e4d8f:
    (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return true;
}

Assistant:

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,
                                  spv_operand_pattern_t* pattern) {
  switch (type) {
    case SPV_OPERAND_TYPE_VARIABLE_ID:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
      // Represents Zero or more (Literal number, Id) pairs,
      // where the literal number must be a scalar integer.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_ID);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_ID_LITERAL_INTEGER:
      // Represents Zero or more (Id, Literal number) pairs.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_LITERAL_INTEGER);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    default:
      break;
  }
  return false;
}